

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O0

bool __thiscall GGSock::FileServer::addFile(FileServer *this,FileData *data)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  pointer pIVar4;
  FileData *in_RSI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff78;
  FileData *this_00;
  lock_guard<std::mutex> *in_stack_ffffffffffffff80;
  FileInfo *in_stack_ffffffffffffff90;
  Impl *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int32_t iVar5;
  reference local_48 [2];
  int local_24;
  FileData *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
  operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_> *
             )0x135680);
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_18->data);
  if (sVar3 == 0) {
    local_1 = 0;
    local_24 = 1;
  }
  else {
    std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
    operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                *)0x1356c7);
    bVar2 = Impl::exists(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    if (bVar2) {
      local_1 = 0;
      local_24 = 1;
    }
    else {
      pIVar4 = std::
               unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
               ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                             *)0x135720);
      iVar1 = pIVar4->currentFileUpdateId;
      pIVar4 = std::
               unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
               ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                             *)0x135731);
      sVar3 = std::
              vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>::
              size(&pIVar4->files);
      if (iVar1 == (int)sVar3) {
        local_1 = 0;
        local_24 = 1;
      }
      else {
        if ((local_18->info).nChunks == 0) {
          pIVar4 = std::
                   unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                   ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                                 *)0x135772);
          (local_18->info).nChunks = (pIVar4->parameters).nDefaultFileChunks;
        }
        iVar5 = (local_18->info).nChunks;
        sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_18->data);
        if ((int)sVar3 < iVar5) {
          sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_18->data);
          (local_18->info).nChunks = (int32_t)sVar3;
        }
        sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_18->data);
        (local_18->info).filesize = sVar3;
        std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
        operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                    *)0x1357de);
        std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
        operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                    *)0x1357f1);
        local_48[0] = std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)
                                 CONCAT44(iVar5,in_stack_ffffffffffffffa0),
                                 (size_type)in_stack_ffffffffffffff98);
        std::_Bit_reference::operator=(local_48,true);
        pIVar4 = std::
                 unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                 ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                               *)0x135842);
        this_00 = (FileData *)&pIVar4->files;
        pIVar4 = std::
                 unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                 ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                               *)0x135854);
        std::vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>::
        operator[]((vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                    *)this_00,(long)pIVar4->currentFileUpdateId);
        FileData::operator=(local_18,this_00);
        pIVar4 = std::
                 unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                 ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                               *)0x135878);
        pIVar4->currentFileUpdateId = pIVar4->currentFileUpdateId + 1;
        pIVar4 = std::
                 unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                 ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                               *)0x13588b);
        pIVar4->changedFileInfos = true;
        local_24 = 0;
      }
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1358a1);
  if (local_24 == 0) {
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool FileServer::addFile(FileData && data) {
    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);

        if (data.data.size() == 0) {
            return false;
        }

        if (m_impl->exists(data.info)) {
            return false;
        }

        // todo : handle max files reached
        if (m_impl->currentFileUpdateId == (int) m_impl->files.size()) {
            return false;
        }

        if (data.info.nChunks == 0) {
            data.info.nChunks = m_impl->parameters.nDefaultFileChunks;
        }

        if (data.info.nChunks > (int32_t) data.data.size()) {
            data.info.nChunks = (int32_t) data.data.size();
        }

        data.info.filesize = data.data.size();

        m_impl->fileUsed[m_impl->currentFileUpdateId] = true;
        m_impl->files[m_impl->currentFileUpdateId] = std::move(data);

        m_impl->currentFileUpdateId++;

        m_impl->changedFileInfos = true;
    }

    return true;
}